

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_all_local(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_BOOL *all_local_nodes)

{
  bool local_35;
  int local_34;
  REF_INT cell_node;
  REF_BOOL *all_local_nodes_local;
  REF_INT cell_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  *all_local_nodes = 1;
  if (((cell < 0) || (ref_cell->max <= cell)) || (ref_cell->c2n[ref_cell->size_per * cell] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x3a0,
           "ref_cell_all_local","invalid cell");
    ref_cell_local._4_4_ = 1;
  }
  else {
    for (local_34 = 0; local_34 < ref_cell->node_per; local_34 = local_34 + 1) {
      local_35 = false;
      if (*all_local_nodes != 0) {
        local_35 = ref_node->ref_mpi->id ==
                   ref_node->part[ref_cell->c2n[local_34 + ref_cell->size_per * cell]];
      }
      *all_local_nodes = (uint)local_35;
    }
    ref_cell_local._4_4_ = 0;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_all_local(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT cell, REF_BOOL *all_local_nodes) {
  REF_INT cell_node;

  *all_local_nodes = REF_TRUE;
  RAS(ref_cell_valid(ref_cell, cell), "invalid cell");

  each_ref_cell_cell_node(ref_cell, cell_node) {
    *all_local_nodes =
        *all_local_nodes &&
        ref_node_owned(ref_node, ref_cell_c2n(ref_cell, cell_node, cell));
  }

  return REF_SUCCESS;
}